

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall spdlog::logger::~logger(logger *this)

{
  this->_vptr_logger = (_func_int **)&PTR__logger_0019eee8;
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  ~vector(&(this->tracer_).messages_.v_);
  std::_Function_base::~_Function_base(&(this->custom_err_handler_).super__Function_base);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&this->sinks_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~logger() = default;